

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O0

int set_insert_array(set s,set_key *keys,set_value *values,size_t size)

{
  ulong in_RCX;
  long in_RDX;
  set_value in_RSI;
  set_key in_RDI;
  size_t iterator;
  ulong local_30;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (((in_RDI == (set_key)0x0) || (in_RSI == (set_value)0x0)) || (in_RDX == 0)) {
    log_write_impl_va("metacall",0xef,"set_insert_array",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                      ,3,"Invalid set array insertion parameters");
    iVar1 = 1;
  }
  else {
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      iVar1 = set_insert((set)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                         in_RSI);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0xf7,"set_insert_array",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                          ,3,"Invalid set array insertion");
        return 1;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int set_insert_array(set s, set_key keys[], set_value values[], size_t size)
{
	size_t iterator;

	if (s == NULL || keys == NULL || values == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set array insertion parameters");
		return 1;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		if (set_insert(s, keys[iterator], values[iterator]) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid set array insertion");
			return 1;
		}
	}

	return 0;
}